

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

Aig_Man_t * Gia_ManToAigSimple(Gia_Man_t *p)

{
  int iVar1;
  int c;
  uint uVar2;
  Aig_Obj_t **ppNodes_00;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  bool bVar5;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Aig_Obj_t **ppNodes;
  Aig_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  ppNodes_00 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
  iVar1 = Gia_ManObjNum(p);
  memset(ppNodes_00,0xff,(long)iVar1 << 3);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p_00->nConstrs = p->nConstrs;
  local_2c = 0;
  while( true ) {
    bVar5 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) {
      iVar1 = Gia_ManRegNum(p);
      Aig_ManSetRegNum(p_00,iVar1);
      if (ppNodes_00 != (Aig_Obj_t **)0x0) {
        free(ppNodes_00);
      }
      return p_00;
    }
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_28);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pGStack_28);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                          ,0x188,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
          }
          pAVar4 = Aig_ManConst0(p_00);
          ppNodes_00[local_2c] = pAVar4;
        }
        else {
          iVar1 = Gia_ObjId(p,pGStack_28);
          pAVar4 = Gia_ObjChild0Copy2(ppNodes_00,pGStack_28,iVar1);
          pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
          ppNodes_00[local_2c] = pAVar4;
        }
      }
      else {
        pAVar4 = Aig_ObjCreateCi(p_00);
        ppNodes_00[local_2c] = pAVar4;
      }
    }
    else {
      iVar1 = Gia_ObjId(p,pGStack_28);
      pAVar4 = Gia_ObjChild0Copy2(ppNodes_00,pGStack_28,iVar1);
      iVar1 = Gia_ObjId(p,pGStack_28);
      p1 = Gia_ObjChild1Copy2(ppNodes_00,pGStack_28,iVar1);
      pAVar4 = Aig_And(p_00,pAVar4,p1);
      ppNodes_00[local_2c] = pAVar4;
    }
    pAVar4 = Aig_Regular(ppNodes_00[local_2c]);
    iVar1 = Aig_ObjId(pAVar4);
    c = Aig_IsComplement(ppNodes_00[local_2c]);
    uVar2 = Abc_Var2Lit(iVar1,c);
    pGStack_28->Value = uVar2;
    if ((local_2c != 0) && (iVar1 = Aig_ObjId(ppNodes_00[local_2c]), iVar1 != local_2c)) break;
    local_2c = local_2c + 1;
  }
  __assert_fail("i == 0 || Aig_ObjId(ppNodes[i]) == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                ,0x18a,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
}

Assistant:

Aig_Man_t * Gia_ManToAigSimple( Gia_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    ppNodes = ABC_FALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            ppNodes[i] = Aig_And( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)), Gia_ObjChild1Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsCi(pObj) )
            ppNodes[i] = Aig_ObjCreateCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            ppNodes[i] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsConst0(pObj) )
            ppNodes[i] = Aig_ManConst0(pNew);
        else
            assert( 0 );
        pObj->Value = Abc_Var2Lit( Aig_ObjId(Aig_Regular(ppNodes[i])), Aig_IsComplement(ppNodes[i]) );
        assert( i == 0 || Aig_ObjId(ppNodes[i]) == i );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}